

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * zlib_mem_deflate(char *data,size_t size,size_t *cdata_size,int level,int strat)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int local_b0;
  int err;
  int cdata_pos;
  int cdata_alloc;
  uchar *cdata;
  z_stream s;
  int strat_local;
  int level_local;
  size_t *cdata_size_local;
  size_t size_local;
  char *data_local;
  
  auVar3._8_4_ = (int)(size >> 0x20);
  auVar3._0_8_ = size;
  auVar3._12_4_ = 0x45300000;
  iVar1 = (int)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) * 1.05 + 100.0);
  s.reserved._0_4_ = strat;
  s.reserved._4_4_ = level;
  data_local = (char *)malloc((long)iVar1);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    local_b0 = 0;
    s.state = (internal_state *)0x0;
    s.zalloc = (alloc_func)0x0;
    s.zfree = (free_func)0x0;
    s.avail_in = 0;
    s._12_4_ = 0;
    s.avail_out = 0;
    s._36_4_ = 0;
    s.opaque._0_4_ = 0;
    cdata = (uchar *)data;
    s.next_in._0_4_ = (int)size;
    s.total_in = (uLong)data_local;
    s.next_out._0_4_ = iVar1;
    iVar2 = deflateInit2_(&cdata,s.reserved._4_4_,8,0x1f,9,(int)s.reserved,"1.2.11",0x70);
    if (iVar2 == 0) {
      do {
        if ((int)s.next_in == 0) goto LAB_001364c7;
        s.total_in = (uLong)(data_local + local_b0);
        s.next_out._0_4_ = iVar1 - local_b0;
        if (iVar1 - local_b0 < 1) {
          fprintf(_stderr,"Deflate produced larger output than expected. Abort\n");
          return (char *)0x0;
        }
        iVar2 = deflate(&cdata,0);
        local_b0 = iVar1 - (int)s.next_out;
      } while (iVar2 == 0);
      fprintf(_stderr,"zlib deflate error: %s\n",s.total_out);
LAB_001364c7:
      iVar1 = deflate(&cdata,4);
      if (iVar1 != 1) {
        fprintf(_stderr,"zlib deflate error: %s\n",s.total_out);
      }
      *cdata_size = s._32_8_;
      iVar1 = deflateEnd(&cdata);
      if (iVar1 != 0) {
        fprintf(_stderr,"zlib deflate error: %s\n",s.total_out);
      }
    }
    else {
      fprintf(_stderr,"zlib deflateInit2 error: %s\n",s.total_out);
      data_local = (char *)0x0;
    }
  }
  return data_local;
}

Assistant:

static char *zlib_mem_deflate(char *data, size_t size, size_t *cdata_size,
			      int level, int strat) {
    z_stream s;
    unsigned char *cdata = NULL; /* Compressed output */
    int cdata_alloc = 0;
    int cdata_pos = 0;
    int err;

    cdata = malloc(cdata_alloc = size*1.05+100);
    if (!cdata)
	return NULL;
    cdata_pos = 0;

    /* Initialise zlib stream */
    s.zalloc = Z_NULL; /* use default allocation functions */
    s.zfree  = Z_NULL;
    s.opaque = Z_NULL;
    s.next_in  = (unsigned char *)data;
    s.avail_in = size;
    s.total_in = 0;
    s.next_out  = cdata;
    s.avail_out = cdata_alloc;
    s.total_out = 0;
    s.data_type = Z_BINARY;

    err = deflateInit2(&s, level, Z_DEFLATED, 15|16, 9, strat);
    if (err != Z_OK) {
	fprintf(stderr, "zlib deflateInit2 error: %s\n", s.msg);
	return NULL;
    }

    /* Encode to 'cdata' array */
    for (;s.avail_in;) {
	s.next_out = &cdata[cdata_pos];
	s.avail_out = cdata_alloc - cdata_pos;
	if (cdata_alloc - cdata_pos <= 0) {
	    fprintf(stderr, "Deflate produced larger output than expected. Abort\n"); 
	    return NULL;
	}
	err = deflate(&s, Z_NO_FLUSH);
	cdata_pos = cdata_alloc - s.avail_out;
	if (err != Z_OK) {
	    fprintf(stderr, "zlib deflate error: %s\n", s.msg);
	    break;
	}
    }
    if (deflate(&s, Z_FINISH) != Z_STREAM_END) {
	fprintf(stderr, "zlib deflate error: %s\n", s.msg);
    }
    *cdata_size = s.total_out;

    if (deflateEnd(&s) != Z_OK) {
	fprintf(stderr, "zlib deflate error: %s\n", s.msg);
    }
    return (char *)cdata;
}